

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O0

CommandVoid2<dynamicgraph::Tracer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
dynamicgraph::command::
makeCommandVoid2<dynamicgraph::Tracer,std::__cxx11::string,std::__cxx11::string>
          (command *this,Tracer *entity,F function,string *docString)

{
  bind_t<void,_boost::_mfi::mf2<void,_dynamicgraph::Tracer,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_boost::_bi::list3<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>,_boost::arg<2>_>_>
  f;
  Tracer *entity_00;
  CommandVoid2<dynamicgraph::Tracer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  F local_70;
  undefined8 uStack_68;
  storage2<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>_> local_60;
  function_t local_58;
  string *local_38;
  string *docString_local;
  F function_local;
  Tracer *local_20;
  Tracer *entity_local;
  F local_10;
  
  local_38 = docString;
  docString_local = (string *)entity;
  function_local = function;
  local_20 = (Tracer *)this;
  entity_local = entity;
  local_10 = function;
  this_00 = (CommandVoid2<dynamicgraph::Tracer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x80);
  entity_00 = local_20;
  boost::
  bind<void,dynamicgraph::Tracer,std::__cxx11::string_const&,std::__cxx11::string_const&,dynamicgraph::Tracer*,boost::arg<1>,boost::arg<2>>
            (&local_70,(boost *)docString_local,function_local);
  f.f_._8_8_ = uStack_68;
  f.f_.f_ = local_70;
  f.l_.super_storage3<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>,_boost::arg<2>_>.
  super_storage2<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>_>.
  super_storage1<boost::_bi::value<dynamicgraph::Tracer_*>_>.a1_.t_ =
       (storage3<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>,_boost::arg<2>_>)
       (storage3<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>,_boost::arg<2>_>)
       local_60.super_storage1<boost::_bi::value<dynamicgraph::Tracer_*>_>.a1_.t_;
  boost::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<boost::_bi::bind_t<void,boost::_mfi::mf2<void,dynamicgraph::Tracer,std::__cxx11::string_const&,std::__cxx11::string_const&>,boost::_bi::list3<boost::_bi::value<dynamicgraph::Tracer*>,boost::arg<1>,boost::arg<2>>>>
            ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_58,f,
             0);
  CommandVoid2<dynamicgraph::Tracer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::CommandVoid2(this_00,entity_00,&local_58,local_38);
  boost::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_58);
  return this_00;
}

Assistant:

CommandVoid2<E, T1, T2> *makeCommandVoid2(E &entity,
                                          void (E::*function)(const T1 &,
                                                              const T2 &),
                                          const std::string &docString) {
  return new CommandVoid2<E, T1, T2>(
      entity, boost::bind(function, &entity, _1, _2), docString);
  return NULL;
}